

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.c
# Opt level: O0

void addVariable(char *key,double val)

{
  _Bool _Var1;
  variable *pvVar2;
  char *pcVar3;
  variable *var;
  double val_local;
  char *key_local;
  
  _Var1 = replaceVariable(key,val);
  if (!_Var1) {
    pvVar2 = (variable *)malloc_(0x18);
    pcVar3 = strDup(key);
    pvVar2->key = pcVar3;
    pvVar2->value = val;
    pvVar2->next = variables_first;
    variables_first = pvVar2;
  }
  return;
}

Assistant:

void addVariable(const char *key, double val)
{
    struct variable *var;

    if (replaceVariable(key, val)) {
        return;
    }

    var = malloc_(sizeof(struct variable));
    var->key = strDup(key);
    var->value = val;

    var->next = variables_first;
    variables_first = var;
}